

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest.hpp
# Opt level: O0

void __thiscall iutest::UnitTestSource::UnitTestSource(UnitTestSource *this)

{
  TestEventListeners *this_00;
  TestEventListener *listener;
  UnitTestSource *this_local;
  
  this_00 = TestEnv::event_listeners();
  listener = (TestEventListener *)operator_new(8);
  DefaultResultPrintListener::DefaultResultPrintListener((DefaultResultPrintListener *)listener);
  TestEventListeners::set_default_result_printer(this_00,listener);
  return;
}

Assistant:

UnitTestSource()
    {
#if defined(_IUTEST_DEBUG)
        detail::iuDebugInitialize();
#else
        IUTEST_UNUSED_VAR(&detail::iuDebugInitialize);
        IUTEST_UNUSED_VAR(&detail::iuDebugBreakAlloc);
#endif
        TestEnv::event_listeners().set_default_result_printer(new DefaultResultPrintListener());
    }